

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

int TTransform(uint8_t *in,uint16_t *w)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int sum;
  int b3;
  int b2;
  int b1;
  int b0;
  int a3_1;
  int a2_1;
  int a1_1;
  int a0_1;
  int a3;
  int a2;
  int a1;
  int a0;
  int i;
  int tmp [16];
  
  tmp[0xb] = 0;
  tmp._48_8_ = in_RSI;
  tmp._56_8_ = in_RDI;
  for (a1_1 = 0; a1_1 < 4; a1_1 = a1_1 + 1) {
    iVar1 = (uint)*(byte *)tmp._56_8_ + (uint)*(byte *)(tmp._56_8_ + 2);
    iVar2 = (uint)*(byte *)(tmp._56_8_ + 1) + (uint)*(byte *)(tmp._56_8_ + 3);
    iVar3 = (uint)*(byte *)(tmp._56_8_ + 1) - (uint)*(byte *)(tmp._56_8_ + 3);
    iVar4 = (uint)*(byte *)tmp._56_8_ - (uint)*(byte *)(tmp._56_8_ + 2);
    (&a0_1)[a1_1 << 2] = iVar1 + iVar2;
    (&a0_1)[a1_1 * 4 + 1] = iVar4 + iVar3;
    (&a0_1)[a1_1 * 4 + 2] = iVar4 - iVar3;
    (&a0_1)[a1_1 * 4 + 3] = iVar1 - iVar2;
    tmp._56_8_ = tmp._56_8_ + 0x20;
  }
  for (a1_1 = 0; a1_1 < 4; a1_1 = a1_1 + 1) {
    iVar1 = (&a0_1)[a1_1] + (&a0_1)[a1_1 + 8] + (&a0_1)[a1_1 + 4] + (&a0_1)[a1_1 + 0xc];
    iVar2 = ((&a0_1)[a1_1] - (&a0_1)[a1_1 + 8]) + ((&a0_1)[a1_1 + 4] - (&a0_1)[a1_1 + 0xc]);
    iVar3 = ((&a0_1)[a1_1] - (&a0_1)[a1_1 + 8]) - ((&a0_1)[a1_1 + 4] - (&a0_1)[a1_1 + 0xc]);
    iVar4 = ((&a0_1)[a1_1] + (&a0_1)[a1_1 + 8]) - ((&a0_1)[a1_1 + 4] + (&a0_1)[a1_1 + 0xc]);
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    tmp[0xb] = (uint)*(ushort *)(tmp._48_8_ + 0x18) * iVar4 +
               (uint)*(ushort *)(tmp._48_8_ + 0x10) * iVar3 +
               (uint)*(ushort *)(tmp._48_8_ + 8) * iVar2 +
               (uint)*(ushort *)tmp._48_8_ * iVar1 + tmp[0xb];
    tmp._48_8_ = tmp._48_8_ + 2;
  }
  return tmp[0xb];
}

Assistant:

static int TTransform(const uint8_t* WEBP_RESTRICT in,
                      const uint16_t* WEBP_RESTRICT w) {
  int sum = 0;
  int tmp[16];
  int i;
  // horizontal pass
  for (i = 0; i < 4; ++i, in += BPS) {
    const int a0 = in[0] + in[2];
    const int a1 = in[1] + in[3];
    const int a2 = in[1] - in[3];
    const int a3 = in[0] - in[2];
    tmp[0 + i * 4] = a0 + a1;
    tmp[1 + i * 4] = a3 + a2;
    tmp[2 + i * 4] = a3 - a2;
    tmp[3 + i * 4] = a0 - a1;
  }
  // vertical pass
  for (i = 0; i < 4; ++i, ++w) {
    const int a0 = tmp[0 + i] + tmp[8 + i];
    const int a1 = tmp[4 + i] + tmp[12+ i];
    const int a2 = tmp[4 + i] - tmp[12+ i];
    const int a3 = tmp[0 + i] - tmp[8 + i];
    const int b0 = a0 + a1;
    const int b1 = a3 + a2;
    const int b2 = a3 - a2;
    const int b3 = a0 - a1;

    sum += w[ 0] * abs(b0);
    sum += w[ 4] * abs(b1);
    sum += w[ 8] * abs(b2);
    sum += w[12] * abs(b3);
  }
  return sum;
}